

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEBody.cpp
# Opt level: O1

CEBody * __thiscall CEBody::operator=(CEBody *this,CEBody *other)

{
  if (this != other) {
    CESkyCoord::operator=(&this->super_CESkyCoord,&other->super_CESkyCoord);
    init_members(this);
    copy_members(this,other);
  }
  return this;
}

Assistant:

CEBody& CEBody::operator=(const CEBody& other)
{
    if (this != &other) {
        // Copy parent class parameters
        this->CESkyCoord::operator=(other);

        // Reset this object and copy values from 'other'
        free_members();
        init_members();
        copy_members(other);
    }
    return *this;
}